

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  int iVar1;
  sqlite3 *db;
  WhereTerm *pWVar2;
  Expr *p;
  WhereClause *pWC_00;
  ushort uVar3;
  long lVar4;
  
  iVar1 = pWC->nTerm;
  if (0 < (long)iVar1) {
    db = pWC->pWInfo->pParse->db;
    pWVar2 = pWC->a;
    lVar4 = 0;
    do {
      uVar3 = *(ushort *)((long)&pWVar2->wtFlags + lVar4);
      if (((uVar3 & 1) != 0) && (p = *(Expr **)((long)&pWVar2->pExpr + lVar4), p != (Expr *)0x0)) {
        sqlite3ExprDeleteNN(db,p);
        uVar3 = *(ushort *)((long)&pWVar2->wtFlags + lVar4);
      }
      if ((uVar3 & 0x30) != 0) {
        pWC_00 = *(WhereClause **)((long)&pWVar2->u + lVar4);
        sqlite3WhereClauseClear(pWC_00);
        if (pWC_00 != (WhereClause *)0x0) {
          sqlite3DbFreeNN(db,pWC_00);
        }
      }
      lVar4 = lVar4 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar4 != 0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  sqlite3 *db = pWC->pWInfo->pParse->db;
  assert( pWC->nTerm>=pWC->nBase );
  if( pWC->nTerm>0 ){
    WhereTerm *a = pWC->a;
    WhereTerm *aLast = &pWC->a[pWC->nTerm-1];
#ifdef SQLITE_DEBUG
    int i;
    /* Verify that every term past pWC->nBase is virtual */
    for(i=pWC->nBase; i<pWC->nTerm; i++){
      assert( (pWC->a[i].wtFlags & TERM_VIRTUAL)!=0 );
    }
#endif
    while(1){
      assert( a->eMatchOp==0 || a->eOperator==WO_AUX );
      if( a->wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, a->pExpr);
      }
      if( a->wtFlags & (TERM_ORINFO|TERM_ANDINFO) ){
        if( a->wtFlags & TERM_ORINFO ){
          assert( (a->wtFlags & TERM_ANDINFO)==0 );
          whereOrInfoDelete(db, a->u.pOrInfo);
        }else{
          assert( (a->wtFlags & TERM_ANDINFO)!=0 );
          whereAndInfoDelete(db, a->u.pAndInfo);
        }
      }
      if( a==aLast ) break;
      a++;
    }
  }
}